

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowLevelIoExamples.cpp
# Opt level: O2

void readRgbaFILE(FILE *cfile,char *fileName,Array2D<Imf_3_2::Rgba> *pixels,int *width,int *height)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  long sizeX;
  RgbaInputFile file;
  C_IStream istr;
  
  C_IStream::C_IStream(&istr,cfile,fileName);
  iVar3 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaInputFile::RgbaInputFile(&file,&istr.super_IStream,iVar3);
  piVar4 = (int *)Imf_3_2::RgbaInputFile::dataWindow();
  iVar3 = *piVar4;
  iVar1 = piVar4[1];
  iVar2 = piVar4[3];
  *width = (piVar4[2] - iVar3) + 1;
  sizeX = ((long)iVar2 - (long)iVar1) + 1;
  *height = (int)sizeX;
  Imf_3_2::Array2D<Imf_3_2::Rgba>::resizeErase(pixels,sizeX,(long)*width);
  Imf_3_2::RgbaInputFile::setFrameBuffer
            ((Rgba *)&file,(ulong)(pixels->_data + (-(long)iVar3 - (long)*width * (long)iVar1)),1);
  Imf_3_2::RgbaInputFile::readPixels((int)&file,iVar1);
  Imf_3_2::RgbaInputFile::~RgbaInputFile(&file);
  Imf_3_2::IStream::~IStream(&istr.super_IStream);
  return;
}

Assistant:

void
readRgbaFILE (
    FILE*          cfile,
    const char     fileName[],
    Array2D<Rgba>& pixels,
    int&           width,
    int&           height)
{
    //
    // Read an RGBA image from a C stdio file that has already been opened:
    //
    //	- create a C_IStream object for reading from the file
    //	- create an RgbaInputFile object, and attach it to the C_IStream
    //	- allocate memory for the pixels
    //	- describe the memory layout of the pixels
    //	- read the pixels from the file
    //

    C_IStream     istr (cfile, fileName);
    RgbaInputFile file (istr);
    Box2i         dw = file.dataWindow ();

    width  = dw.max.x - dw.min.x + 1;
    height = dw.max.y - dw.min.y + 1;
    pixels.resizeErase (height, width);

    file.setFrameBuffer (&pixels[0][0] - dw.min.x - dw.min.y * width, 1, width);
    file.readPixels (dw.min.y, dw.max.y);
}